

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (0 < nvec) {
    if (nvec == 2) {
      N_VLinearSum_Serial(*c,*X,c[1],X[1],z);
    }
    else if (nvec == 1) {
      N_VScale_Serial(*c,*X,z);
    }
    else {
      lVar2 = *z->content;
      lVar1 = *(long *)((long)z->content + 0x10);
      if (*X == z) {
        lVar4 = 0;
        if (0 < lVar2) {
          lVar4 = lVar2;
        }
        if ((*c != 1.0) || (NAN(*c))) {
          for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
            *(double *)(lVar1 + lVar2 * 8) = *c * *(double *)(lVar1 + lVar2 * 8);
          }
          for (uVar5 = 1; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
            lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
            for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
              *(double *)(lVar1 + lVar3 * 8) =
                   c[uVar5] * *(double *)(lVar2 + lVar3 * 8) + *(double *)(lVar1 + lVar3 * 8);
            }
          }
        }
        else {
          for (uVar5 = 1; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
            lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
            for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
              *(double *)(lVar1 + lVar3 * 8) =
                   c[uVar5] * *(double *)(lVar2 + lVar3 * 8) + *(double *)(lVar1 + lVar3 * 8);
            }
          }
        }
      }
      else {
        lVar4 = *(long *)((long)(*X)->content + 0x10);
        lVar3 = 0;
        if (lVar2 < 1) {
          lVar2 = lVar3;
        }
        for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
          *(double *)(lVar1 + lVar3 * 8) = *c * *(double *)(lVar4 + lVar3 * 8);
        }
        for (uVar5 = 1; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
          lVar4 = *(long *)((long)X[uVar5]->content + 0x10);
          for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
            *(double *)(lVar1 + lVar3 * 8) =
                 c[uVar5] * *(double *)(lVar4 + lVar3 * 8) + *(double *)(lVar1 + lVar3 * 8);
          }
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}